

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool __thiscall ON_String::EqualOrdinal(ON_String *this,char *other_string,bool bOrdinalIgnoreCase)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  char *string1;
  
  element_count1 = Length(this);
  iVar2 = Length(other_string);
  if (element_count1 == iVar2) {
    string1 = operator_cast_to_char_(this);
    bVar1 = EqualOrdinal(string1,element_count1,other_string,element_count1,bOrdinalIgnoreCase);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_String::EqualOrdinal(
  const char* other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  const int length = Length();
  return (length == ON_String::Length(other_string))
    && ON_String::EqualOrdinal(
    static_cast< const char* >(*this),
    length,
    other_string,
    length,
    bOrdinalIgnoreCase
    );
}